

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int32 get_quests(node *root,int32 **qarr,int32 *nph,int32 nquests,int32 depth)

{
  int32 *piVar1;
  bool bVar2;
  int iVar3;
  int32 *__base;
  long lVar4;
  int nquests_00;
  size_t __nmemb;
  
  iVar3 = root->nphones;
  if (depth < 4 || 1 < iVar3) {
    do {
      nquests_00 = nquests;
      if (0 < depth) {
        __base = (int32 *)__ckd_calloc__((long)iVar3,4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                         ,0x2ba);
        __nmemb = (size_t)root->nphones;
        if (0 < (long)__nmemb) {
          piVar1 = root->phoneids;
          lVar4 = 0;
          do {
            __base[lVar4] = piVar1[lVar4];
            lVar4 = lVar4 + 1;
            __nmemb = (size_t)root->nphones;
          } while (lVar4 < (long)__nmemb);
        }
        qsort(__base,__nmemb,4,compare);
        iVar3 = root->nphones;
        nph[nquests] = iVar3;
        nquests_00 = nquests + 1;
        qarr[nquests] = __base;
      }
      if (iVar3 < 2) {
        return nquests_00;
      }
      nquests = nquests_00;
      if (root->left != (node *)0x0) {
        nquests = get_quests(root->left,qarr,nph,nquests_00,depth + 1);
      }
      root = root->right;
      if (root == (node_str *)0x0) {
        return nquests;
      }
      iVar3 = root->nphones;
      bVar2 = depth < 3;
      depth = depth + 1;
    } while (bVar2 || 1 < iVar3);
  }
  return nquests;
}

Assistant:

int32 get_quests(node *root,int32 **qarr,int32 *nph,int32 nquests,int32 depth)
{
    int32 *sortedidx,i;

    if (root->nphones < 2 && depth > 3) return nquests;

    if (depth > 0){
        sortedidx = (int32 *)ckd_calloc(root->nphones,sizeof(int32));
        for (i=0;i<root->nphones;i++) sortedidx[i] = root->phoneids[i];
        qsort(sortedidx,root->nphones,sizeof(int32),compare);
        nph[nquests] = root->nphones;
        qarr[nquests++] = sortedidx;
    }

    if (root->nphones < 2) return nquests;
    if (root->left != NULL) 
        nquests = get_quests(root->left,qarr,nph,nquests,depth+1);
    if (root->right != NULL) 
        nquests = get_quests(root->right,qarr,nph,nquests,depth+1);

    return nquests;
}